

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall Clasp::Solver::updateBranch(Solver *this,uint32 n)

{
  size_type sVar1;
  uint in_EAX;
  uint uVar2;
  ulong uVar3;
  pointer puVar4;
  VarVec *this_00;
  undefined8 uStack_18;
  
  sVar1 = (this->levels_).super_type.ebo_.size;
  uVar2 = (this->cflStamp_).ebo_.size;
  uVar3 = (ulong)uVar2;
  this_00 = &this->cflStamp_;
  if ((int)sVar1 < (int)(uVar2 - 1)) {
    puVar4 = (this_00->ebo_).buf;
    do {
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
      n = n + puVar4[uVar3];
      (this->cflStamp_).ebo_.size = uVar2;
    } while (sVar1 + 1 != uVar2);
  }
  else {
    puVar4 = (this_00->ebo_).buf;
    if ((int)uVar2 <= (int)sVar1) {
      uStack_18 = (ulong)in_EAX;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                (this_00,puVar4 + uVar3,sVar1 - (uVar2 - 1),(uint *)((long)&uStack_18 + 4));
      puVar4 = (this->cflStamp_).ebo_.buf;
      uVar2 = (this->cflStamp_).ebo_.size;
    }
  }
  puVar4[uVar2 - 1] = puVar4[uVar2 - 1] + n;
  return;
}

Assistant:

void Solver::updateBranch(uint32 n) {
	int32 dl = (int32)decisionLevel(), xl = static_cast<int32>(cflStamp_.size())-1;
	if      (xl > dl) { do { n += cflStamp_.back(); cflStamp_.pop_back(); } while (--xl != dl); }
	else if (dl > xl) { cflStamp_.insert(cflStamp_.end(), dl - xl, 0); }
	cflStamp_.back() += n;
}